

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

void __thiscall
libcellml::Analyser::AnalyserImpl::analyseComponent(AnalyserImpl *this,ComponentPtr *component)

{
  AnalyserInternalEquation *this_00;
  IssueImpl *this_01;
  size_type sVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  undefined8 uVar2;
  bool bVar3;
  AnalyserInternalVariable *pAVar4;
  long *plVar5;
  size_t sVar6;
  size_type *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  XmlNodePtr node;
  IssuePtr issue;
  AnalyserInternalVariablePtr internalVariable;
  AnalyserInternalEquationPtr internalEquation;
  VariablePtr variable;
  string local_f8;
  string local_d0;
  XmlNodePtr local_b0;
  IssuePtr local_a0;
  undefined1 local_90 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  undefined1 local_68 [32];
  AnalyserInternalVariable *local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_40;
  AnalyserInternalEquationPtrs *local_38;
  
  Component::math_abi_cxx11_
            (&local_f8,
             (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  sVar1 = local_f8._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Component::math_abi_cxx11_
              (&local_f8,
               (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    multiRootXml((vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
                  *)local_90,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_48 = (AnalyserInternalVariable *)local_90._8_8_;
    if (local_90._0_8_ != local_90._8_8_) {
      local_38 = &this->mInternalEquations;
      this_00 = (AnalyserInternalEquation *)(local_90 + 0x18);
      pAVar4 = (AnalyserInternalVariable *)local_90._0_8_;
      do {
        local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAVar4;
        XmlDoc::rootNode((XmlDoc *)&local_f8);
        XmlNode::firstChild((XmlNode *)&local_b0);
        while( true ) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0) break;
          bVar3 = XmlNode::isMathmlElement
                            (local_b0.
                             super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,(char *)0x0);
          if (bVar3) {
            AnalyserInternalEquation::create(this_00,component);
            std::
            vector<std::shared_ptr<libcellml::AnalyserInternalEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserInternalEquation>_>_>
            ::push_back(local_38,(value_type *)this_00);
            uVar2 = local_90._24_8_;
            AnalyserEquationAst::parent((AnalyserEquationAst *)&local_f8);
            analyseNode(this,&local_b0,(AnalyserEquationAstPtr *)(uVar2 + 0x20),
                        (AnalyserEquationAstPtr *)&local_f8,component,
                        (AnalyserInternalEquationPtr *)this_00);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
            }
            if (*(int *)**(undefined8 **)(local_90._24_8_ + 0x20) != 0) {
              Issue::IssueImpl::create();
              this_01 = (local_a0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->mPimpl;
              expression_abi_cxx11_
                        ((string *)local_68,this,(AnalyserEquationAstPtr *)(local_90._24_8_ + 0x20),
                         true);
              plVar5 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x29d567)
              ;
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              psVar7 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar7) {
                local_d0.field_2._M_allocated_capacity = *psVar7;
                local_d0.field_2._8_8_ = plVar5[3];
              }
              else {
                local_d0.field_2._M_allocated_capacity = *psVar7;
                local_d0._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_d0._M_string_length = plVar5[1];
              *plVar5 = (long)psVar7;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 == paVar8) {
                local_f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_f8.field_2._8_8_ = plVar5[3];
              }
              else {
                local_f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_f8._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_f8._M_string_length = plVar5[1];
              *plVar5 = (long)paVar8;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              Issue::IssueImpl::setDescription(this_01,&local_f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((Variable *)local_68._0_8_ != (Variable *)(local_68 + 0x10)) {
                operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
              }
              Issue::IssueImpl::setReferenceRule
                        ((local_a0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl,ANALYSER_EQUATION_NOT_EQUALITY_STATEMENT);
              AnyCellmlElement::AnyCellmlElementImpl::setComponent
                        ((((local_a0.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->mPimpl->mItem).
                          super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,component,COMPONENT);
              Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_a0);
              if (local_a0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_a0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
            }
            if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
            }
          }
          XmlNode::next((XmlNode *)&local_f8);
          this_02._M_pi =
               local_b0.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          local_b0.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length;
          local_b0.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_f8._M_dataplus._M_p;
          local_f8._M_dataplus._M_p = (pointer)0x0;
          local_f8._M_string_length = 0;
          if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
          }
        }
        if (local_b0.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b0.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        pAVar4 = (AnalyserInternalVariable *)(local_40._M_pi + 1);
      } while (pAVar4 != local_48);
    }
    std::
    vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
    ::~vector((vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
               *)local_90);
  }
  sVar6 = Component::variableCount
                    ((component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (sVar6 != 0) {
    uVar9 = 0;
    do {
      Component::variable((Component *)local_68,
                          (size_t)(component->
                                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr);
      AnalyserImpl::internalVariable((AnalyserImpl *)local_90,(VariablePtr *)this);
      Variable::initialValue_abi_cxx11_(&local_f8,(Variable *)local_68._0_8_);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar3 = false;
      }
      else {
        Variable::initialValue_abi_cxx11_
                  (&local_d0,
                   (((VariablePtr *)(local_90._0_8_ + 0x20))->
                   super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        bVar3 = local_d0._M_string_length == 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        AnalyserInternalVariable::setVariable
                  ((AnalyserInternalVariable *)local_90._0_8_,(VariablePtr *)local_68,true);
      }
      if ((AnalyserInternalVariable *)local_90._8_8_ != (AnalyserInternalVariable *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
      }
      uVar9 = uVar9 + 1;
      sVar6 = Component::variableCount
                        ((component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
    } while (uVar9 < sVar6);
  }
  sVar6 = ComponentEntity::componentCount
                    (&((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_ComponentEntity);
  if (sVar6 != 0) {
    uVar9 = 0;
    do {
      ComponentEntity::component
                ((ComponentEntity *)&local_f8,
                 (size_t)(component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      analyseComponent(this,(ComponentPtr *)&local_f8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
      }
      uVar9 = uVar9 + 1;
      sVar6 = ComponentEntity::componentCount
                        (&((component->
                           super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->super_ComponentEntity);
    } while (uVar9 < sVar6);
  }
  return;
}

Assistant:

void Analyser::AnalyserImpl::analyseComponent(const ComponentPtr &component)
{
    // Retrieve the math string associated with the given component and analyse
    // it, one equation at a time, keeping in mind that it may consist of
    // several <math> elements, hence our use of multiRootXml().

    if (!component->math().empty()) {
        for (const auto &doc : multiRootXml(component->math())) {
            for (auto node = doc->rootNode()->firstChild(); node != nullptr; node = node->next()) {
                if (node->isMathmlElement()) {
                    // Create and keep track of the equation associated with the
                    // given node.

                    auto internalEquation = AnalyserInternalEquation::create(component);

                    mInternalEquations.push_back(internalEquation);

                    // Actually analyse the node.
                    // Note: we must not test internalEquation->mAst->parent()
                    //       since if it is equal to nullptr then a parent will
                    //       be created by analyseNode().

                    analyseNode(node, internalEquation->mAst, internalEquation->mAst->parent(), component, internalEquation);

                    // Make sure that our internal equation is an equality
                    // statement.

                    if (internalEquation->mAst->mPimpl->mType != AnalyserEquationAst::Type::EQUALITY) {
                        auto issue = Issue::IssueImpl::create();

                        issue->mPimpl->setDescription("Equation " + expression(internalEquation->mAst)
                                                      + " is not an equality statement (i.e. LHS = RHS).");
                        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ANALYSER_EQUATION_NOT_EQUALITY_STATEMENT);
                        issue->mPimpl->mItem->mPimpl->setComponent(component);

                        addIssue(issue);
                    }
                }
            }
        }
    }

    // Go through the given component's variables and internally keep track of
    // the ones that have an initial value.

    for (size_t i = 0; i < component->variableCount(); ++i) {
        // If `variable` has an initial value and the variable held by
        // `internalVariable` doesn't, then replace the variable held by
        // `internalVariable`.

        auto variable = component->variable(i);
        auto internalVariable = Analyser::AnalyserImpl::internalVariable(variable);

        if (!variable->initialValue().empty()
            && internalVariable->mVariable->initialValue().empty()) {
            internalVariable->setVariable(variable);
        }
    }

    // Do the same for the components encapsulated by the given component.

    for (size_t i = 0; i < component->componentCount(); ++i) {
        analyseComponent(component->component(i));
    }
}